

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

LY_ERR ly_ctx_unset_options(ly_ctx *ctx,uint16_t option)

{
  uint uVar1;
  lys_module *mod;
  lysc_ext_instance *plVar2;
  lysc_ext_substmt *plVar3;
  ushort uVar4;
  ulong uVar5;
  void *pvVar6;
  void **ppvVar7;
  ulong uVar8;
  void *pvVar9;
  char *pcVar10;
  lysc_node *root;
  void **ppvVar11;
  
  if (ctx == (ly_ctx *)0x0) {
    pcVar10 = "ctx";
    ctx = (ly_ctx *)0x0;
  }
  else {
    if ((option & 4) == 0) {
      uVar4 = ctx->flags;
      if ((option >> 10 & 1) != 0 && (uVar4 >> 10 & 1) != 0) {
        lyht_free(ctx->leafref_links_ht,ly_ctx_ht_leafref_links_rec_free);
        ctx->leafref_links_ht = (ly_ht *)0x0;
        uVar4 = ctx->flags;
      }
      if (((option & 0x40) != 0 && (uVar4 & 0x40) != 0) &&
         (uVar1 = (ctx->list).count, uVar5 = (ulong)uVar1, uVar1 != 0)) {
        uVar8 = 0;
        do {
          mod = (lys_module *)(ctx->list).field_2.dnodes[uVar8];
          if (mod == (lys_module *)0x0) break;
          if (mod->compiled != (lysc_module *)0x0) {
            lysc_module_dfs_full(mod,lysc_node_clear_priv_dfs_cb,(void *)0x0);
            pvVar9 = (void *)0x0;
            while( true ) {
              plVar2 = mod->compiled->exts;
              if (plVar2 == (lysc_ext_instance *)0x0) {
                pvVar6 = (void *)0x0;
              }
              else {
                pvVar6 = plVar2[-1].compiled;
              }
              if (pvVar6 <= pvVar9) break;
              ppvVar11 = (void **)0x0;
              while( true ) {
                plVar3 = plVar2[(long)pvVar9].substmts;
                if (plVar3 == (lysc_ext_substmt *)0x0) {
                  ppvVar7 = (void **)0x0;
                }
                else {
                  ppvVar7 = plVar3[-1].storage_p;
                }
                if (ppvVar7 <= ppvVar11) break;
                if ((plVar3[(long)ppvVar11].stmt &
                    (LY_STMT_LIST|LY_STMT_LEAF_LIST|LY_STMT_LEAF|LY_STMT_CONTAINER|LY_STMT_CHOICE|
                     LY_STMT_CASE|LY_STMT_ANYXML|LY_STMT_ANYDATA)) != LY_STMT_NONE) {
                  for (root = (lysc_node *)*plVar3[(long)ppvVar11].storage_p;
                      root != (lysc_node *)0x0; root = root->next) {
                    lysc_tree_dfs_full(root,lysc_node_clear_priv_dfs_cb,(void *)0x0);
                  }
                }
                ppvVar11 = (void **)((long)ppvVar11 + 1);
              }
              pvVar9 = (void *)((long)pvVar9 + 1);
            }
            uVar5 = (ulong)(ctx->list).count;
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < uVar5);
        uVar4 = ctx->flags;
      }
      ctx->flags = uVar4 & ~option;
      return LY_SUCCESS;
    }
    pcVar10 = "option";
  }
  ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar10,"ly_ctx_unset_options");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_ctx_unset_options(struct ly_ctx *ctx, uint16_t option)
{
    LY_ARRAY_COUNT_TYPE u, v;
    const struct lysc_ext_instance *ext;
    struct lysc_node *root;

    LY_CHECK_ARG_RET(ctx, ctx, LY_EINVAL);
    LY_CHECK_ERR_RET(option & LY_CTX_NO_YANGLIBRARY, LOGARG(ctx, option), LY_EINVAL);

    if ((ctx->flags & LY_CTX_LEAFREF_LINKING) && (option & LY_CTX_LEAFREF_LINKING)) {
        lyht_free(ctx->leafref_links_ht, ly_ctx_ht_leafref_links_rec_free);
        ctx->leafref_links_ht = NULL;
    }

    if ((ctx->flags & LY_CTX_SET_PRIV_PARSED) && (option & LY_CTX_SET_PRIV_PARSED)) {
        struct lys_module *mod;
        uint32_t index;

        index = 0;
        while ((mod = ly_ctx_get_module_iter(ctx, &index))) {
            if (!mod->compiled) {
                continue;
            }

            /* set NULL for all ::lysc_node.priv pointers in module */
            lysc_module_dfs_full(mod, lysc_node_clear_priv_dfs_cb, NULL);

            /* set NULL for all ::lysc_node.priv pointers in compiled extension instances */
            LY_ARRAY_FOR(mod->compiled->exts, u) {
                ext = &mod->compiled->exts[u];
                LY_ARRAY_FOR(ext->substmts, v) {
                    if (ext->substmts[v].stmt & LY_STMT_DATA_NODE_MASK) {
                        LY_LIST_FOR(*ext->substmts[v].storage_p, root) {
                            lysc_tree_dfs_full(root, lysc_node_clear_priv_dfs_cb, NULL);
                        }
                    }
                }
            }
        }
    }

    /* unset the option(s) */
    ctx->flags &= ~option;

    return LY_SUCCESS;
}